

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void find_parameter_C(problem *prob,parameter *param,int nr_fold,double start_C,double max_C,
                     double *best_C,double *best_rate)

{
  undefined4 uVar1;
  double dVar2;
  _func_void_char_ptr *p_Var3;
  int iVar4;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  ulong uVar5;
  void *__ptr_03;
  long lVar6;
  void *pvVar7;
  model *model_;
  ulong uVar8;
  _func_void_char_ptr *p_Var9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  feature_node *pfVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  size_t __size;
  double dVar18;
  double dVar19;
  int local_13c;
  model *submodel;
  undefined8 local_b8;
  int *piStack_b0;
  double *local_a8;
  double dStack_a0;
  double *local_98;
  undefined8 local_88;
  double dStack_80;
  undefined8 local_78;
  double dStack_70;
  double local_68;
  undefined8 local_60;
  int *piStack_58;
  double *local_50;
  double dStack_48;
  long local_40;
  
  uVar16 = prob->l;
  lVar11 = (long)(int)uVar16;
  __ptr = malloc(lVar11 * 4);
  __ptr_00 = malloc(lVar11 * 8);
  __ptr_01 = malloc((long)nr_fold << 5);
  __ptr_02 = malloc((long)nr_fold * 8);
  uVar5 = 0;
  uVar8 = 0;
  if (0 < nr_fold) {
    uVar8 = (ulong)(uint)nr_fold;
  }
  for (; p_Var3 = liblinear_print_string, uVar8 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)__ptr_02 + uVar5 * 8) = 0;
  }
  local_88 = *(undefined8 *)param;
  dStack_80 = param->eps;
  local_b8._0_4_ = param->nr_thread;
  local_b8._4_4_ = param->nr_weight;
  piStack_b0 = param->weight_label;
  local_a8 = param->weight;
  dStack_a0 = param->p;
  local_98 = param->init_sol;
  if ((int)uVar16 < nr_fold) {
    fwrite("WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n"
           ,100,1,_stderr);
    nr_fold = uVar16;
  }
  __ptr_03 = malloc((long)nr_fold * 4 + 4);
  uVar5 = 0;
  uVar8 = 0;
  if (0 < (int)uVar16) {
    uVar8 = (ulong)uVar16;
  }
  for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    *(int *)((long)__ptr + uVar5 * 4) = (int)uVar5;
  }
  uVar14 = uVar16;
  for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    iVar4 = rand();
    lVar6 = (long)(iVar4 % (int)uVar14) + uVar5;
    uVar1 = *(undefined4 *)((long)__ptr + uVar5 * 4);
    *(undefined4 *)((long)__ptr + uVar5 * 4) = *(undefined4 *)((long)__ptr + lVar6 * 4);
    *(undefined4 *)((long)__ptr + lVar6 * 4) = uVar1;
    uVar14 = uVar14 - 1;
  }
  iVar4 = 0;
  for (lVar6 = 0; lVar6 <= nr_fold; lVar6 = lVar6 + 1) {
    *(int *)((long)__ptr_03 + lVar6 * 4) = iVar4 / nr_fold;
    iVar4 = iVar4 + uVar16;
  }
  if (nr_fold < 1) {
    nr_fold = 0;
  }
  uVar8 = (ulong)(uint)nr_fold;
  uVar5 = 0;
  while (uVar5 != uVar8) {
    uVar14 = *(uint *)((long)__ptr_03 + uVar5 * 4);
    uVar10 = uVar5 + 1;
    iVar4 = *(int *)((long)__ptr_03 + uVar5 * 4 + 4);
    lVar17 = (long)iVar4;
    lVar6 = uVar5 * 0x20;
    *(double *)((long)__ptr_01 + lVar6 + 0x18) = prob->bias;
    *(int *)((long)__ptr_01 + lVar6 + 4) = prob->n;
    iVar4 = (uVar14 - iVar4) + uVar16;
    *(int *)((long)__ptr_01 + lVar6) = iVar4;
    __size = (long)iVar4 << 3;
    pvVar7 = malloc(__size);
    *(void **)((long)__ptr_01 + lVar6 + 0x10) = pvVar7;
    pvVar7 = malloc(__size);
    *(void **)((long)__ptr_01 + lVar6 + 8) = pvVar7;
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    uVar12 = (ulong)uVar14;
    for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
      iVar4 = *(int *)((long)__ptr + uVar5 * 4);
      *(feature_node **)(*(long *)((long)__ptr_01 + lVar6 + 0x10) + uVar5 * 8) = prob->x[iVar4];
      *(double *)(*(long *)((long)__ptr_01 + lVar6 + 8) + uVar5 * 8) = prob->y[iVar4];
    }
    for (; uVar5 = uVar10, lVar17 < lVar11; lVar17 = lVar17 + 1) {
      iVar4 = *(int *)((long)__ptr + lVar17 * 4);
      *(feature_node **)(*(long *)((long)__ptr_01 + lVar6 + 0x10) + uVar12 * 8) = prob->x[iVar4];
      *(double *)(*(long *)((long)__ptr_01 + lVar6 + 8) + uVar12 * 8) = prob->y[iVar4];
      uVar12 = uVar12 + 1;
    }
  }
  *best_rate = 0.0;
  dVar18 = 0.0;
  if (0.0 < start_C) goto LAB_00107fe4;
  uVar16 = prob->l;
  uVar5 = 0;
  uVar10 = 0;
  if (0 < (int)uVar16) {
    uVar10 = (ulong)uVar16;
  }
  for (; uVar5 != uVar10; uVar5 = uVar5 + 1) {
    dVar2 = 0.0;
    for (pfVar13 = prob->x[uVar5]; pfVar13->index != -1; pfVar13 = pfVar13 + 1) {
      dVar2 = dVar2 + pfVar13->value * pfVar13->value;
    }
    if (dVar2 <= dVar18) {
      dVar2 = dVar18;
    }
    dVar18 = dVar2;
  }
  if (param->solver_type == 2) {
    uVar16 = uVar16 * 2;
LAB_00107fb6:
    dVar18 = 1.0 / (dVar18 * (double)(int)uVar16);
  }
  else {
    if (param->solver_type == 0) goto LAB_00107fb6;
    dVar18 = 1.0;
  }
  dVar18 = log(dVar18);
  dVar18 = floor(dVar18 / 0.6931471805599453);
  start_C = exp2(dVar18);
LAB_00107fe4:
  p_Var9 = print_string_stdout;
  if (p_Var3 != (_func_void_char_ptr *)0x0) {
    p_Var9 = p_Var3;
  }
  local_13c = 0;
  dVar18 = start_C;
  do {
    dVar2 = dVar18;
    if (max_C < dVar2) break;
    liblinear_print_string = print_null;
    uVar5 = 0;
    while (uVar5 != uVar8) {
      lVar6 = (long)*(int *)((long)__ptr_03 + uVar5 * 4);
      iVar4 = *(int *)((long)__ptr_03 + uVar5 * 4 + 4);
      local_78 = local_88;
      dStack_70 = dStack_80;
      local_50 = local_a8;
      dStack_48 = dStack_a0;
      local_60 = local_b8;
      piStack_58 = piStack_b0;
      lVar11 = *(long *)((long)__ptr_02 + uVar5 * 8);
      local_68 = dVar2;
      local_40 = lVar11;
      model_ = train((problem *)((long)__ptr_01 + uVar5 * 0x20),(parameter *)&local_78);
      iVar15 = model_->nr_class;
      if (iVar15 == 2) {
        iVar15 = 1;
      }
      uVar16 = iVar15 * *(int *)((long)__ptr_01 + uVar5 * 0x20 + 4);
      submodel = model_;
      if (lVar11 == 0) {
        pvVar7 = malloc((long)(int)uVar16 << 3);
        *(void **)((long)__ptr_02 + uVar5 * 8) = pvVar7;
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
          *(double *)((long)pvVar7 + uVar10 * 8) = model_->w[uVar10];
        }
      }
      else {
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        if (local_13c < 0) {
          for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
            *(double *)(lVar11 + uVar10 * 8) = model_->w[uVar10];
          }
        }
        else {
          dVar18 = 0.0;
          for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
            dVar19 = model_->w[uVar10] - *(double *)(lVar11 + uVar10 * 8);
            dVar18 = dVar18 + dVar19 * dVar19;
            *(double *)(lVar11 + uVar10 * 8) = model_->w[uVar10];
          }
          if (dVar18 < 0.0) {
            dVar18 = sqrt(dVar18);
          }
          else {
            dVar18 = SQRT(dVar18);
          }
          if (1e-15 < dVar18) {
            local_13c = -1;
          }
        }
      }
      uVar5 = uVar5 + 1;
      for (; lVar6 < iVar4; lVar6 = lVar6 + 1) {
        lVar11 = (long)*(int *)((long)__ptr + lVar6 * 4);
        dVar18 = predict(model_,prob->x[lVar11]);
        *(double *)((long)__ptr_00 + lVar11 * 8) = dVar18;
      }
      free_and_destroy_model(&submodel);
    }
    uVar16 = prob->l;
    uVar5 = 0;
    uVar10 = 0;
    if (0 < (int)uVar16) {
      uVar10 = (ulong)uVar16;
    }
    iVar4 = 0;
    for (; uVar10 != uVar5; uVar5 = uVar5 + 1) {
      iVar4 = iVar4 + (uint)(prob->y[uVar5] == *(double *)((long)__ptr_00 + uVar5 * 8));
    }
    dVar18 = (double)iVar4 / (double)(int)uVar16;
    liblinear_print_string = p_Var9;
    if (*best_rate <= dVar18 && dVar18 != *best_rate) {
      *best_C = dVar2;
      *best_rate = dVar18;
    }
    dVar19 = log(dVar2);
    info("log2c=%7.2f\trate=%g\n",SUB84(dVar19 / 0.6931471805599453,0),dVar18 * 100.0);
    local_13c = local_13c + 1;
    dVar18 = dVar2 + dVar2;
  } while (local_13c != 3);
  if ((start_C < max_C) && (max_C < dVar2)) {
    info("warning: maximum C reached.\n");
  }
  free(__ptr_03);
  free(__ptr);
  free(__ptr_00);
  for (lVar11 = 0; uVar8 * 8 != lVar11; lVar11 = lVar11 + 8) {
    free(*(void **)((long)__ptr_01 + lVar11 * 4 + 0x10));
    free(*(void **)((long)__ptr_01 + lVar11 * 4 + 8));
    free(*(void **)((long)__ptr_02 + lVar11));
  }
  free(__ptr_02);
  free(__ptr_01);
  return;
}

Assistant:

void find_parameter_C(const problem *prob, const parameter *param, int nr_fold, double start_C, double max_C, double *best_C, double *best_rate)
{
	// variables for CV
	int i;
	int *fold_start;
	int l = prob->l;
	int *perm = Malloc(int, l);
	double *target = Malloc(double, prob->l);
	struct problem *subprob = Malloc(problem,nr_fold);

	// variables for warm start
	double ratio = 2;
	double **prev_w = Malloc(double*, nr_fold);
	for(i = 0; i < nr_fold; i++)
		prev_w[i] = NULL;
	int num_unchanged_w = 0;
	struct parameter param1 = *param;
	void (*default_print_string) (const char *) = liblinear_print_string;

	if (nr_fold > l)
	{
		nr_fold = l;
		fprintf(stderr,"WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n");
	}
	fold_start = Malloc(int,nr_fold+1);
	for(i=0;i<l;i++) perm[i]=i;
	for(i=0;i<l;i++)
	{
		int j = i+rand()%(l-i);
		swap(perm[i],perm[j]);
	}
	for(i=0;i<=nr_fold;i++)
		fold_start[i]=i*l/nr_fold;

	for(i=0;i<nr_fold;i++)
	{
		int begin = fold_start[i];
		int end = fold_start[i+1];
		int j,k;

		subprob[i].bias = prob->bias;
		subprob[i].n = prob->n;
		subprob[i].l = l-(end-begin);
		subprob[i].x = Malloc(struct feature_node*,subprob[i].l);
		subprob[i].y = Malloc(double,subprob[i].l);

		k=0;
		for(j=0;j<begin;j++)
		{
			subprob[i].x[k] = prob->x[perm[j]];
			subprob[i].y[k] = prob->y[perm[j]];
			++k;
		}
		for(j=end;j<l;j++)
		{
			subprob[i].x[k] = prob->x[perm[j]];
			subprob[i].y[k] = prob->y[perm[j]];
			++k;
		}

	}

	*best_rate = 0;
	if(start_C <= 0)
		start_C = calc_start_C(prob,param);
	param1.C = start_C;

	while(param1.C <= max_C)
	{
		//Output diabled for running CV at a particular C
		set_print_string_function(&print_null);

#ifdef CV_OMP
#pragma omp parallel for private(i) schedule(dynamic)
#endif
		for(i=0; i<nr_fold; i++)
		{
			int j;
			int begin = fold_start[i];
			int end = fold_start[i+1];

			struct parameter param_t = param1;
			param_t.init_sol = prev_w[i];
			struct model *submodel = train(&subprob[i],&param_t);

			int total_w_size;
			if(submodel->nr_class == 2)
				total_w_size = subprob[i].n;
			else
				total_w_size = subprob[i].n * submodel->nr_class;

			if(prev_w[i] == NULL)
			{
				prev_w[i] = Malloc(double, total_w_size);
				for(j=0; j<total_w_size; j++)
					prev_w[i][j] = submodel->w[j];
			}
			else if(num_unchanged_w >= 0)
			{
				double norm_w_diff = 0;
				for(j=0; j<total_w_size; j++)
				{
					norm_w_diff += (submodel->w[j] - prev_w[i][j])*(submodel->w[j] - prev_w[i][j]);
					prev_w[i][j] = submodel->w[j];
				}
				norm_w_diff = sqrt(norm_w_diff);

				if(norm_w_diff > 1e-15)
					num_unchanged_w = -1;
			}
			else
			{
				for(j=0; j<total_w_size; j++)
					prev_w[i][j] = submodel->w[j];
			}

			for(j=begin; j<end; j++)
				target[perm[j]] = predict(submodel,prob->x[perm[j]]);

			free_and_destroy_model(&submodel);
		}
		set_print_string_function(default_print_string);

		int total_correct = 0;
		for(i=0; i<prob->l; i++)
			if(target[i] == prob->y[i])
				++total_correct;
		double current_rate = (double)total_correct/prob->l;
		if(current_rate > *best_rate)
		{
			*best_C = param1.C;
			*best_rate = current_rate;
		}

		info("log2c=%7.2f\trate=%g\n",log(param1.C)/log(2.0),100.0*current_rate);
		num_unchanged_w++;
		if(num_unchanged_w == 3)
			break;
		param1.C = param1.C*ratio;
	}

	if(param1.C > max_C && max_C > start_C) 
		info("warning: maximum C reached.\n");
	free(fold_start);
	free(perm);
	free(target);
	for(i=0; i<nr_fold; i++)
	{
		free(subprob[i].x);
		free(subprob[i].y);
		free(prev_w[i]);
	}
	free(prev_w);
	free(subprob);
}